

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::merge_or_update
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *source)

{
  byte bVar1;
  object *this_00;
  object *source_00;
  json_runtime_error<std::domain_error,_void> *pjVar2;
  string local_38;
  
  while( true ) {
    for (; bVar1 = (byte)*(object_storage *)source & 0xf, bVar1 == 9;
        source = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                  ((long)source + 8)) {
    }
    if (bVar1 == 4) {
      return;
    }
    if (bVar1 != 0xd) {
      pjVar2 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Attempting to merge a value that is not an object","");
      json_runtime_error<std::domain_error,_void>::json_runtime_error(pjVar2,&local_38);
      __cxa_throw(pjVar2,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    bVar1 = (byte)*(object_storage *)this & 0xf;
    if (bVar1 != 9) break;
    this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)((long)this + 8);
  }
  if (bVar1 != 0xd) {
    if (bVar1 != 4) {
      pjVar2 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Attempting to merge or update a value that is not an object",
                 "");
      json_runtime_error<std::domain_error,_void>::json_runtime_error(pjVar2,&local_38);
      __cxa_throw(pjVar2,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    create_object_implicitly(this);
  }
  this_00 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
            value_abi_cxx11_((object_storage *)this);
  source_00 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
              value_abi_cxx11_((object_storage *)source);
  sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  ::merge_or_update(this_00,source_00);
  return;
}

Assistant:

void merge_or_update(const basic_json& source)
        {
            switch (source.storage_kind())
            {
                case json_storage_kind::empty_object:
                    break;
                case json_storage_kind::object:
                    switch (storage_kind())
                    {
                        case json_storage_kind::empty_object:
                            create_object_implicitly();
                            cast<object_storage>().value().merge_or_update(source.cast<object_storage>().value());
                            break;
                        case json_storage_kind::object:
                            cast<object_storage>().value().merge_or_update(source.cast<object_storage>().value());
                            break;
                        case json_storage_kind::json_reference:
                            cast<json_reference_storage>().value().merge_or_update(source);
                            break;
                        default:
                            JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to merge or update a value that is not an object"));
                    }
                    break;
                case json_storage_kind::json_reference:
                    merge_or_update(source.cast<json_reference_storage>().value());
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to merge a value that is not an object"));
            }
        }